

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
::ConvertFromStruct(JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
                    *this,vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
                          *list)

{
  bool bVar1;
  ElementsDecodeRawTransactionTxOut *in_RDI;
  ElementsDecodeRawTransactionTxOut object;
  ElementsDecodeRawTransactionTxOutStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  *__range3;
  ElementsDecodeRawTransactionTxOutStruct *in_stack_fffffffffffffd28;
  value_type *in_stack_fffffffffffffd38;
  vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
  *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffdc0;
  __normal_iterator<const_ElementsDecodeRawTransactionTxOutStruct_*,_std::vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ElementsDecodeRawTransactionTxOutStruct *)
       ::std::
       vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
       ::begin(in_stack_fffffffffffffd28);
  ::std::
  vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
  ::end((vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
         *)in_stack_fffffffffffffd28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ElementsDecodeRawTransactionTxOutStruct_*,_std::vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_ElementsDecodeRawTransactionTxOutStruct_*,_std::vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_ElementsDecodeRawTransactionTxOutStruct_*,_std::vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffd28 = (ElementsDecodeRawTransactionTxOutStruct *)&stack0xfffffffffffffd48;
    cfd::api::json::ElementsDecodeRawTransactionTxOut::ElementsDecodeRawTransactionTxOut
              ((ElementsDecodeRawTransactionTxOut *)in_stack_fffffffffffffdc0);
    cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertFromStruct
              (in_RDI,in_stack_fffffffffffffd28);
    ::std::
    vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
    ::push_back(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    cfd::api::json::ElementsDecodeRawTransactionTxOut::~ElementsDecodeRawTransactionTxOut(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_ElementsDecodeRawTransactionTxOutStruct_*,_std::vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }